

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_mpi.c
# Opt level: O1

int kvtree_send(kvtree *hash,int rank,MPI_Comm comm)

{
  size_t sVar1;
  int size;
  char *buf;
  int local_34;
  char *local_30;
  
  sVar1 = kvtree_pack_size(hash);
  if ((sVar1 & 0xffffffff80000000) != 0) {
    kvtree_abort(-1,"kvtree_send: hash size %lu is bigger than INT_MAX %d @ %s:%d",sVar1,0x7fffffff,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_mpi.c"
                 ,0x24);
  }
  local_34 = (int)sVar1;
  MPI_Send(&local_34,1,&ompi_mpi_int,rank,0,comm);
  if (0 < (long)local_34) {
    local_30 = (char *)kvtree_malloc((long)local_34,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_mpi.c"
                                     ,0x30);
    kvtree_pack(local_30,hash);
    MPI_Send(local_30,local_34,&ompi_mpi_byte,rank,0,comm);
    kvtree_free(&local_30);
  }
  return 0;
}

Assistant:

int kvtree_send(const kvtree* hash, int rank, MPI_Comm comm)
{
  /* get size of hash and check that it doesn't exceed INT_MAX */
  size_t pack_size = kvtree_pack_size(hash);
  size_t max_int = (size_t) INT_MAX;
  if (pack_size > max_int) {
    kvtree_abort(-1, "kvtree_send: hash size %lu is bigger than INT_MAX %d @ %s:%d",
      (unsigned long) pack_size, INT_MAX, __FILE__, __LINE__
    );
  }

  /* tell destination how big the pack size is */
  int size = (int) pack_size;
  MPI_Send(&size, 1, MPI_INT, rank, 0, comm);

  /* pack the hash and send it */
  if (size > 0) {
    /* allocate a buffer big enough to pack the hash */
    /* pack the hash, send it, and free our buffer */
    char* buf = (char*) KVTREE_MALLOC((size_t)size);
    kvtree_pack(buf, hash);
    MPI_Send(buf, size, MPI_BYTE, rank, 0, comm);
    kvtree_free(&buf);
  }

  return KVTREE_SUCCESS;
}